

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptNativeIntArray::SetItem
          (JavascriptNativeIntArray *this,uint32 index,Var value,PropertyOperationFlags flags)

{
  TypeId TVar1;
  double local_30;
  double dValue;
  int32 iValue;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this);
  TVar1 = TrySetNativeIntArrayItem(this,value,(int32 *)((long)&dValue + 4),&local_30);
  if (TVar1 == TypeIds_ArrayLast) {
    JavascriptArray::DirectSetItemAt<double>((JavascriptArray *)this,index,local_30);
  }
  else if (TVar1 == TypeIds_NativeIntArray) {
    SetItem(this,index,dValue._4_4_);
  }
  else {
    JavascriptArray::DirectSetItemAt<void*>((JavascriptArray *)this,index,value);
  }
  return 1;
}

Assistant:

BOOL JavascriptNativeIntArray::SetItem(uint32 index, Var value, PropertyOperationFlags flags)
    {
        int32 iValue;
        double dValue;
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        TypeId typeId = this->TrySetNativeIntArrayItem(value, &iValue, &dValue);
        if (typeId == TypeIds_NativeIntArray)
        {
            this->SetItem(index, iValue);
        }
        else if (typeId == TypeIds_NativeFloatArray)
        {
            reinterpret_cast<JavascriptNativeFloatArray*>(this)->DirectSetItemAt<double>(index, dValue);
        }
        else
        {
            this->DirectSetItemAt<Var>(index, value);
        }

        return TRUE;
    }